

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

png_uint_16 png_gamma_correct(png_structrp png_ptr,uint value,png_fixed_point gamma_val)

{
  byte bVar1;
  png_uint_16 pVar2;
  
  if (png_ptr->bit_depth == '\b') {
    bVar1 = png_gamma_8bit_correct(value,gamma_val);
    return (png_uint_16)bVar1;
  }
  pVar2 = png_gamma_16bit_correct(value,gamma_val);
  return pVar2;
}

Assistant:

png_uint_16 /* PRIVATE */
png_gamma_correct(png_structrp png_ptr, unsigned int value,
    png_fixed_point gamma_val)
{
   if (png_ptr->bit_depth == 8)
      return png_gamma_8bit_correct(value, gamma_val);

#ifdef PNG_16BIT_SUPPORTED
   else
      return png_gamma_16bit_correct(value, gamma_val);
#else
      /* should not reach this */
      return 0;
#endif /* 16BIT */
}